

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O3

void free_deviceOrModule_members(IOTHUB_DEVICE_OR_MODULE *deviceInfo)

{
  free(deviceInfo->deviceId);
  free(deviceInfo->primaryKey);
  free(deviceInfo->secondaryKey);
  free(deviceInfo->generationId);
  free(deviceInfo->eTag);
  free(deviceInfo->connectionStateUpdatedTime);
  free(deviceInfo->statusReason);
  free(deviceInfo->statusUpdatedTime);
  free(deviceInfo->lastActivityTime);
  free(deviceInfo->configuration);
  free(deviceInfo->deviceProperties);
  free(deviceInfo->serviceProperties);
  free(deviceInfo->moduleId);
  free(deviceInfo->managedBy);
  memset(deviceInfo,0,0xa0);
  return;
}

Assistant:

static void free_deviceOrModule_members(IOTHUB_DEVICE_OR_MODULE* deviceInfo)
{
    free((void*)deviceInfo->deviceId);
    free((void*)deviceInfo->primaryKey);
    free((void*)deviceInfo->secondaryKey);
    free((void*)deviceInfo->generationId);
    free((void*)deviceInfo->eTag);
    free((void*)deviceInfo->connectionStateUpdatedTime);
    free((void*)deviceInfo->statusReason);
    free((void*)deviceInfo->statusUpdatedTime);
    free((void*)deviceInfo->lastActivityTime);
    free((void*)deviceInfo->configuration);
    free((void*)deviceInfo->deviceProperties);
    free((void*)deviceInfo->serviceProperties);
    free((void*)deviceInfo->moduleId);
    free((void*)deviceInfo->managedBy);
    memset(deviceInfo, 0, sizeof(*deviceInfo));
}